

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O0

Float __thiscall
Gecko::FunctionalQuasiconvex::optimum
          (FunctionalQuasiconvex *this,
          vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *v,Float lmin)

{
  bool bVar1;
  const_reference pWVar2;
  size_type sVar3;
  pointer pWVar4;
  vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  double dVar6;
  Float f;
  Float l;
  const_iterator q;
  WeightedSum s;
  const_iterator p;
  Float min;
  Float x;
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  Float in_stack_ffffffffffffff74;
  Float in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Float FVar7;
  WeightedValue local_54;
  float local_4c;
  WeightedValue *local_48;
  __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
  local_40;
  undefined1 local_38 [8];
  WeightedValue *local_30;
  __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
  local_28;
  float local_1c;
  Float local_18;
  float local_14;
  vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *local_10;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  pWVar2 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::operator[]
                     (in_RSI,0);
  local_18 = pWVar2->value;
  local_1c = std::numeric_limits<float>::max();
  sVar3 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::size(local_10);
  if (sVar3 != 1) {
    if (sVar3 == 2) {
      pWVar2 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::operator[]
                         (local_10,1);
      FVar7 = pWVar2->weight;
      pWVar2 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::operator[]
                         (local_10,0);
      if (pWVar2->weight <= FVar7 && FVar7 != pWVar2->weight) {
        pWVar2 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::
                 operator[](local_10,1);
        local_18 = pWVar2->value;
      }
    }
    else {
      local_28._M_current =
           (WeightedValue *)
           std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::begin
                     ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      while( true ) {
        local_30 = (WeightedValue *)
                   std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::end
                             ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *
                              )CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (!bVar1) break;
        WeightedSum::WeightedSum
                  ((WeightedSum *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        local_40._M_current =
             (WeightedValue *)
             std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::begin
                       ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        while( true ) {
          local_48 = (WeightedValue *)
                     std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::end
                               ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>
                                 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          if (!bVar1) break;
          pWVar4 = __gnu_cxx::
                   __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                   ::operator->(&local_28);
          in_stack_ffffffffffffff78 = pWVar4->value;
          pWVar4 = __gnu_cxx::
                   __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                   ::operator->(&local_40);
          dVar6 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff78 - pWVar4->value));
          fVar5 = SUB84(dVar6,0);
          local_4c = fVar5;
          if (local_14 < fVar5) {
            pWVar4 = __gnu_cxx::
                     __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                     ::operator->(&local_40);
            WeightedValue::WeightedValue(&local_54,fVar5,pWVar4->weight);
            (**(code **)(*in_RDI + 0x20))(in_RDI,local_38,&local_54);
            in_stack_ffffffffffffff74 = fVar5;
          }
          __gnu_cxx::
          __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
          ::operator++((__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (int)in_stack_ffffffffffffff74);
        }
        fVar5 = (float)(**(code **)(*in_RDI + 0x40))(in_RDI,local_38);
        if (fVar5 < local_1c) {
          local_1c = fVar5;
          pWVar4 = __gnu_cxx::
                   __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                   ::operator->(&local_28);
          local_18 = pWVar4->value;
        }
        __gnu_cxx::
        __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
        ::operator++((__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)in_stack_ffffffffffffff74);
      }
    }
  }
  return local_18;
}

Assistant:

Float optimum(const std::vector<WeightedValue>& v, Float lmin) const
  {
    // Compute the optimum as the node position that minimizes the
    // functional.  Any nodes coincident with each candidate position
    // are excluded from the functional.
    Float x = v[0].value;
    Float min = GECKO_FLOAT_MAX;
    switch (v.size()) {
      case 1:
        // Only one choice.
        break;
      case 2:
        // Functional is the same for both nodes; pick node with
        // larger weight.
        if (v[1].weight > v[0].weight)
          x = v[1].value;
        break;
      default: 
        for (std::vector<WeightedValue>::const_iterator p = v.begin(); p != v.end(); p++) {
          WeightedSum s;
          for (std::vector<WeightedValue>::const_iterator q = v.begin(); q != v.end(); q++) {
            Float l = std::fabs(p->value - q->value);
            if (l > lmin)
              accumulate(s, WeightedValue(l, q->weight));
          }
          Float f = mean(s);
          if (f < min) {
            min = f;
            x = p->value;
          }
        }
        break;
    }
    return x;
  }